

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O0

TreeOrError * slang::syntax::SyntaxTree::fromFile(string_view path)

{
  TreeOrError *in_RDI;
  Bag *in_stack_000000b0;
  SourceManager *in_stack_000000b8;
  undefined1 in_stack_000000c0 [16];
  
  getDefaultSourceManager();
  Bag::Bag((Bag *)0x2d215a);
  fromFile((string_view)in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  Bag::~Bag((Bag *)0x2d2184);
  return in_RDI;
}

Assistant:

SyntaxTree::TreeOrError SyntaxTree::fromFile(std::string_view path) {
    return fromFile(path, getDefaultSourceManager());
}